

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestCaseResult.hpp
# Opt level: O3

Image * __thiscall xe::ri::List::allocItem<xe::ri::Image>(List *this)

{
  Image *pIVar1;
  Image *local_18;
  
  std::vector<xe::ri::Item_*,_std::allocator<xe::ri::Item_*>_>::reserve
            (&this->m_items,
             ((long)(this->m_items).
                    super__Vector_base<xe::ri::Item_*,_std::allocator<xe::ri::Item_*>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->m_items).
                    super__Vector_base<xe::ri::Item_*,_std::allocator<xe::ri::Item_*>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3) + 1);
  pIVar1 = (Image *)operator_new(0x78);
  (pIVar1->super_Item).m_type = TYPE_IMAGE;
  (pIVar1->super_Item)._vptr_Item = (_func_int **)&PTR__Image_0011b980;
  (pIVar1->name)._M_dataplus._M_p = (pointer)&(pIVar1->name).field_2;
  (pIVar1->name)._M_string_length = 0;
  (pIVar1->name).field_2._M_local_buf[0] = '\0';
  (pIVar1->description)._M_dataplus._M_p = (pointer)&(pIVar1->description).field_2;
  (pIVar1->description)._M_string_length = 0;
  (pIVar1->description).field_2._M_local_buf[0] = '\0';
  pIVar1->width = 0;
  pIVar1->height = 0;
  pIVar1->format = FORMAT_LAST;
  pIVar1->compression = COMPRESSION_LAST;
  (pIVar1->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pIVar1->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pIVar1->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_18 = pIVar1;
  std::vector<xe::ri::Item*,std::allocator<xe::ri::Item*>>::emplace_back<xe::ri::Item*>
            ((vector<xe::ri::Item*,std::allocator<xe::ri::Item*>> *)this,(Item **)&local_18);
  return pIVar1;
}

Assistant:

T* List::allocItem (void)
{
	m_items.reserve(m_items.size()+1);
	T* item = new T();
	m_items.push_back(static_cast<ri::Item*>(item));
	return item;
}